

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O1

int main(void)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  chck_atlas_rect tr;
  uint32_t h;
  chck_atlas atlas;
  uint32_t w;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  uint local_44;
  undefined1 local_40 [16];
  int local_30;
  int local_2c;
  int local_28;
  uint local_1c;
  
  cVar1 = chck_atlas(local_40);
  if (cVar1 == '\0') {
    __assert_fail("chck_atlas(&atlas)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                  ,0xd,"int main(void)");
  }
  if (local_30 != 0) {
    __assert_fail("atlas.count == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                  ,0xe,"int main(void)");
  }
  iVar2 = chck_atlas_push(local_40,0x140,0x140);
  if (iVar2 == 0) {
    __assert_fail("chck_atlas_push(&atlas, 320, 320)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                  ,0x10,"int main(void)");
  }
  if (local_30 != 1) {
    __assert_fail("atlas.count == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                  ,0x11,"int main(void)");
  }
  iVar2 = chck_atlas_pop(local_40);
  if (iVar2 != 0) {
    __assert_fail("chck_atlas_pop(&atlas) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                  ,0x13,"int main(void)");
  }
  if (local_30 != 0) {
    __assert_fail("atlas.count == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                  ,0x14,"int main(void)");
  }
  iVar2 = chck_atlas_push(local_40,0x140,0x140);
  if (iVar2 != 1) {
    __assert_fail("chck_atlas_push(&atlas, 320, 320) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                  ,0x16,"int main(void)");
  }
  iVar2 = chck_atlas_push(local_40,0x20,0x20);
  if (iVar2 != 2) {
    __assert_fail("chck_atlas_push(&atlas, 32, 32) == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                  ,0x17,"int main(void)");
  }
  iVar2 = chck_atlas_push(local_40,0x20,0x120);
  if (iVar2 != 3) {
    __assert_fail("chck_atlas_push(&atlas, 32, 288) == 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                  ,0x18,"int main(void)");
  }
  if (local_30 != 3) {
    __assert_fail("atlas.count == 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                  ,0x19,"int main(void)");
  }
  if ((local_2c != 0x140) || (local_28 != 0x1b800)) {
    __assert_fail("atlas.longest_edge == 320 && atlas.total_area == 320 * 320 + 32 * 32 + 32 * 288",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                  ,0x1a,"int main(void)");
  }
  uVar3 = chck_atlas_pack(local_40,0,0,&local_1c,&local_44);
  printf("%ux%u (%u)\n",(ulong)local_1c,(ulong)local_44,(ulong)uVar3);
  if (((local_1c != 0x160) || (local_44 != 0x140)) || (uVar3 != 0x1b800U - local_28)) {
    __assert_fail("w == 352 && h == 320 && free == w * h - atlas.total_area",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                  ,0x20,"int main(void)");
  }
  lVar4 = chck_atlas_get(local_40,1,&local_54);
  if (lVar4 == 0) {
    __assert_fail("(t = chck_atlas_get(&atlas, 1, &tr))",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                  ,0x24,"int main(void)");
  }
  if (((local_54 != 0) || (local_50 != 0)) || ((local_4c != 0x140 || (local_48 != 0x140)))) {
    __assert_fail("tr.x == 0 && tr.y == 0 && tr.w == 320 && tr.h == 320",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                  ,0x25,"int main(void)");
  }
  if (((*(char *)(lVar4 + 0x18) != '\0') || (*(char *)(lVar4 + 0x19) != '\x01')) ||
     ((*(int *)(lVar4 + 0x14) != 0x140 || (*(int *)(lVar4 + 0x10) != 0x19000)))) {
    __assert_fail("!t->flipped && t->placed && t->longest_edge == 320 && t->area == 320 * 320",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                  ,0x26,"int main(void)");
  }
  lVar4 = chck_atlas_get(local_40,2,&local_54);
  if (lVar4 == 0) {
    __assert_fail("(t = chck_atlas_get(&atlas, 2, &tr))",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                  ,0x28,"int main(void)");
  }
  if ((((local_54 == 0x140) && (local_50 == 0x120)) && (local_4c == 0x20)) && (local_48 == 0x20)) {
    if (((*(char *)(lVar4 + 0x18) != '\0') || (*(char *)(lVar4 + 0x19) != '\x01')) ||
       ((*(int *)(lVar4 + 0x14) != 0x20 || (*(int *)(lVar4 + 0x10) != 0x400)))) {
      __assert_fail("!t->flipped && t->placed && t->longest_edge == 32 && t->area == 32 * 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                    ,0x2a,"int main(void)");
    }
    lVar4 = chck_atlas_get(local_40,3,&local_54);
    if (lVar4 == 0) {
      __assert_fail("(t = chck_atlas_get(&atlas, 3, &tr))",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                    ,0x2c,"int main(void)");
    }
    if (((local_54 != 0x140) || (local_50 != 0)) || ((local_4c != 0x20 || (local_48 != 0x120)))) {
      __assert_fail("tr.x == 320 && tr.y == 0 && tr.w == 32 && tr.h == 288",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                    ,0x2d,"int main(void)");
    }
    if ((((*(char *)(lVar4 + 0x18) != '\0') || (*(char *)(lVar4 + 0x19) != '\x01')) ||
        (*(int *)(lVar4 + 0x14) != 0x120)) || (*(int *)(lVar4 + 0x10) != 0x2400)) {
      __assert_fail("!t->flipped && t->placed && t->longest_edge == 288 && t->area == 32 * 288",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                    ,0x2e,"int main(void)");
    }
    chck_atlas_release(local_40);
    cVar1 = chck_atlas(local_40);
    if (cVar1 == '\0') {
      __assert_fail("chck_atlas(&atlas)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                    ,0x36,"int main(void)");
    }
    iVar2 = chck_atlas_push(local_40,0x140,0x140);
    if (iVar2 != 1) {
      __assert_fail("chck_atlas_push(&atlas, 320, 320) == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                    ,0x37,"int main(void)");
    }
    iVar2 = chck_atlas_push(local_40,0x20,0x20);
    if (iVar2 != 2) {
      __assert_fail("chck_atlas_push(&atlas, 32, 32) == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                    ,0x38,"int main(void)");
    }
    iVar2 = chck_atlas_push(local_40,0x20,0x120);
    if (iVar2 != 3) {
      __assert_fail("chck_atlas_push(&atlas, 32, 288) == 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                    ,0x39,"int main(void)");
    }
    if ((local_30 != 3) || (local_28 != 0x1b800)) {
      __assert_fail("atlas.count == 3 && atlas.total_area == 320 * 320 + 32 * 32 + 32 * 288",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                    ,0x3a,"int main(void)");
    }
    uVar3 = chck_atlas_pack(local_40,1,0,&local_1c,&local_44);
    printf("%ux%u (%u)\n",(ulong)local_1c,(ulong)local_44,(ulong)uVar3);
    if (((local_1c != 0x200) || (local_44 != 0x200)) || (uVar3 != 0x40000U - local_28)) {
      __assert_fail("w == 512 && h == 512 && free == w * h - atlas.total_area",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                    ,0x3f,"int main(void)");
    }
    lVar4 = chck_atlas_get(local_40,1,&local_54);
    if (lVar4 == 0) {
      __assert_fail("(t = chck_atlas_get(&atlas, 1, &tr))",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                    ,0x43,"int main(void)");
    }
    if ((((local_54 != 0) || (local_50 != 0)) || (local_4c != 0x140)) || (local_48 != 0x140)) {
      __assert_fail("tr.x == 0 && tr.y == 0 && tr.w == 320 && tr.h == 320",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                    ,0x44,"int main(void)");
    }
    if (((*(char *)(lVar4 + 0x18) != '\0') || (*(char *)(lVar4 + 0x19) != '\x01')) ||
       ((*(int *)(lVar4 + 0x14) != 0x140 || (*(int *)(lVar4 + 0x10) != 0x19000)))) {
      __assert_fail("!t->flipped && t->placed && t->longest_edge == 320 && t->area == 320 * 320",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                    ,0x45,"int main(void)");
    }
    lVar4 = chck_atlas_get(local_40,2,&local_54);
    if (lVar4 == 0) {
      __assert_fail("(t = chck_atlas_get(&atlas, 2, &tr))",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                    ,0x47,"int main(void)");
    }
    if (((local_54 == 0x140) && (local_50 == 0x120)) && ((local_4c == 0x20 && (local_48 == 0x20))))
    {
      if ((((*(char *)(lVar4 + 0x18) != '\0') || (*(char *)(lVar4 + 0x19) != '\x01')) ||
          (*(int *)(lVar4 + 0x14) != 0x20)) || (*(int *)(lVar4 + 0x10) != 0x400)) {
        __assert_fail("!t->flipped && t->placed && t->longest_edge == 32 && t->area == 32 * 32",
                      "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                      ,0x49,"int main(void)");
      }
      lVar4 = chck_atlas_get(local_40,3,&local_54);
      if (lVar4 == 0) {
        __assert_fail("(t = chck_atlas_get(&atlas, 3, &tr))",
                      "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                      ,0x4b,"int main(void)");
      }
      if (((local_54 == 0x140) && (local_50 == 0)) && ((local_4c == 0x20 && (local_48 == 0x120)))) {
        if (((*(char *)(lVar4 + 0x18) == '\0') && (*(char *)(lVar4 + 0x19) == '\x01')) &&
           ((*(int *)(lVar4 + 0x14) == 0x120 && (*(int *)(lVar4 + 0x10) == 0x2400)))) {
          chck_atlas_release(local_40);
          return 0;
        }
        __assert_fail("!t->flipped && t->placed && t->longest_edge == 288 && t->area == 32 * 288",
                      "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                      ,0x4d,"int main(void)");
      }
      __assert_fail("tr.x == 320 && tr.y == 0 && tr.w == 32 && tr.h == 288",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                    ,0x4c,"int main(void)");
    }
    __assert_fail("tr.x == 320 && tr.y == 288 && tr.w == 32 && tr.h == 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                  ,0x48,"int main(void)");
  }
  __assert_fail("tr.x == 320 && tr.y == 288 && tr.w == 32 && tr.h == 32",
                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                ,0x29,"int main(void)");
}

Assistant:

int main(void)
{
   /* TEST: atlas packing */
   {
      struct chck_atlas atlas;
      assert(chck_atlas(&atlas));
      assert(atlas.count == 0);

      assert(chck_atlas_push(&atlas, 320, 320));
      assert(atlas.count == 1);

      assert(chck_atlas_pop(&atlas) == 0);
      assert(atlas.count == 0);

      assert(chck_atlas_push(&atlas, 320, 320) == 1);
      assert(chck_atlas_push(&atlas, 32, 32) == 2);
      assert(chck_atlas_push(&atlas, 32, 288) == 3);
      assert(atlas.count == 3);
      assert(atlas.longest_edge == 320 && atlas.total_area == 320 * 320 + 32 * 32 + 32 * 288);

      uint32_t w, h;
      uint32_t free = chck_atlas_pack(&atlas, false, false, &w, &h);

      printf("%ux%u (%u)\n", w, h, free);
      assert(w == 352 && h == 320 && free == w * h - atlas.total_area);

      struct chck_atlas_rect tr;
      const struct chck_atlas_texture *t;
      assert((t = chck_atlas_get(&atlas, 1, &tr)));
      assert(tr.x == 0 && tr.y == 0 && tr.w == 320 && tr.h == 320);
      assert(!t->flipped && t->placed && t->longest_edge == 320 && t->area == 320 * 320);

      assert((t = chck_atlas_get(&atlas, 2, &tr)));
      assert(tr.x == 320 && tr.y == 288 && tr.w == 32 && tr.h == 32);
      assert(!t->flipped && t->placed && t->longest_edge == 32 && t->area == 32 * 32);

      assert((t = chck_atlas_get(&atlas, 3, &tr)));
      assert(tr.x == 320 && tr.y == 0 && tr.w == 32 && tr.h == 288);
      assert(!t->flipped && t->placed && t->longest_edge == 288 && t->area == 32 * 288);

      chck_atlas_release(&atlas);
   }

   /* TEST: atlas packing (forced pot) */
   {
      struct chck_atlas atlas;
      assert(chck_atlas(&atlas));
      assert(chck_atlas_push(&atlas, 320, 320) == 1);
      assert(chck_atlas_push(&atlas, 32, 32) == 2);
      assert(chck_atlas_push(&atlas, 32, 288) == 3);
      assert(atlas.count == 3 && atlas.total_area == 320 * 320 + 32 * 32 + 32 * 288);

      uint32_t w, h;
      uint32_t free = chck_atlas_pack(&atlas, true, false, &w, &h);
      printf("%ux%u (%u)\n", w, h, free);
      assert(w == 512 && h == 512 && free == w * h - atlas.total_area);

      struct chck_atlas_rect tr;
      const struct chck_atlas_texture *t;
      assert((t = chck_atlas_get(&atlas, 1, &tr)));
      assert(tr.x == 0 && tr.y == 0 && tr.w == 320 && tr.h == 320);
      assert(!t->flipped && t->placed && t->longest_edge == 320 && t->area == 320 * 320);

      assert((t = chck_atlas_get(&atlas, 2, &tr)));
      assert(tr.x == 320 && tr.y == 288 && tr.w == 32 && tr.h == 32);
      assert(!t->flipped && t->placed && t->longest_edge == 32 && t->area == 32 * 32);

      assert((t = chck_atlas_get(&atlas, 3, &tr)));
      assert(tr.x == 320 && tr.y == 0 && tr.w == 32 && tr.h == 288);
      assert(!t->flipped && t->placed && t->longest_edge == 288 && t->area == 32 * 288);

      chck_atlas_release(&atlas);
   }

   return EXIT_SUCCESS;
}